

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O2

EnumValue *
google::protobuf::util::converter::FindEnumValueByNumberOrNull(Enum *enum_type,int32 value)

{
  Type *pTVar1;
  int index;
  
  pTVar1 = (Type *)0x0;
  if (enum_type != (Enum *)0x0) {
    index = 0;
    do {
      if ((enum_type->enumvalue_).super_RepeatedPtrFieldBase.current_size_ <= index) {
        return (EnumValue *)0x0;
      }
      pTVar1 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                         (&(enum_type->enumvalue_).super_RepeatedPtrFieldBase,index);
      index = index + 1;
    } while (pTVar1->number_ != value);
  }
  return pTVar1;
}

Assistant:

const google::protobuf::EnumValue* FindEnumValueByNumberOrNull(
    const google::protobuf::Enum* enum_type, int32 value) {
  if (enum_type != nullptr) {
    for (int i = 0; i < enum_type->enumvalue_size(); ++i) {
      const google::protobuf::EnumValue& enum_value = enum_type->enumvalue(i);
      if (enum_value.number() == value) {
        return &enum_value;
      }
    }
  }
  return nullptr;
}